

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

OP1aHeader * __thiscall ASDCP::MXF::OP1aHeader::InitFromBuffer(OP1aHeader *this,byte_t *p,ui32_t l)

{
  int iVar1;
  undefined8 *puVar2;
  InterchangeObject *ThePacket;
  MDDEntry *pMVar3;
  ILogSink *pIVar4;
  uint in_ECX;
  undefined4 in_register_00000014;
  undefined8 *puVar5;
  ui32_t l_00;
  undefined **local_98;
  undefined1 local_90;
  undefined8 local_8f;
  undefined8 uStack_87;
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000014,l);
  if (*(long *)(p + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x355,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::InitFromBuffer(const byte_t *, ui32_t)"
                 );
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
  puVar2 = (undefined8 *)((ulong)in_ECX + (long)puVar5);
  while ((-1 < *(int *)&(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket
         && (puVar5 < puVar2))) {
    local_90 = 1;
    local_8f = *puVar5;
    uStack_87 = puVar5[1];
    local_98 = &PTR__IArchive_002112c8;
    ThePacket = CreateObject(*(Dictionary **)(p + 0x78),(UL *)&stack0xffffffffffffff68);
    if (ThePacket == (InterchangeObject *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x35d,
                    "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::InitFromBuffer(const byte_t *, ui32_t)"
                   );
    }
    ThePacket->m_Lookup = (IPrimerLookup *)(p + 0x1b0);
    l_00 = (ui32_t)puVar5;
    (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[5])
              ((Result_t *)&stack0xffffffffffffff68,ThePacket,puVar5,(ulong)((int)puVar2 - l_00));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    puVar5 = (undefined8 *)
             ((ulong)(ThePacket->super_KLVPacket).m_KLLength +
              (ThePacket->super_KLVPacket).m_ValueLength + (long)puVar5);
    if (*(int *)&(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket < 0) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"Error initializing OP1a header packet.\n");
      (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[1])(ThePacket);
    }
    else {
      pMVar3 = Dictionary::Type(*(Dictionary **)(p + 0x78),MDD_KLVFill);
      iVar1 = (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[0xf])(ThePacket,pMVar3);
      if ((char)iVar1 == '\0') {
        pMVar3 = Dictionary::Type(*(Dictionary **)(p + 0x78),MDD_Primer);
        iVar1 = (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[0xf])(ThePacket,pMVar3);
        if ((char)iVar1 == '\0') {
          Partition::PacketList::AddPacket(*(PacketList **)(p + 0x70),ThePacket);
          pMVar3 = Dictionary::Type(*(Dictionary **)(p + 0x78),MDD_Preface);
          iVar1 = (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[0xf])(ThePacket,pMVar3);
          if (((byte)iVar1 & *(long *)(p + 0x210) == 0) == 1) {
            *(InterchangeObject **)(p + 0x210) = ThePacket;
          }
        }
        else {
          (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[1])(ThePacket);
          Primer::InitFromBuffer((Primer *)&stack0xffffffffffffff68,p + 0x140,l_00);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
          Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        }
      }
      else {
        (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[1])(ThePacket);
        if (puVar2 <= puVar5 && (long)puVar5 - (long)puVar2 != 0) {
          pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar4,"Fill item short read: %d.\n",(long)puVar5 - (long)puVar2);
        }
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromBuffer(const byte_t* p, ui32_t l)
{
  assert(m_Dict);
  Result_t result = RESULT_OK;
  const byte_t* end_p = p + l;

  while ( ASDCP_SUCCESS(result) && p < end_p )
    {
      // parse the packets and index them by uid, discard KLVFill items
      InterchangeObject* object = CreateObject(m_Dict, p);
      assert(object);

      object->m_Lookup = &m_Primer;
      result = object->InitFromBuffer(p, end_p - p);

      const byte_t* redo_p = p;
      p += object->PacketLength();

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( object->IsA(m_Dict->ul(MDD_KLVFill)) )
	    {
	      delete object;

	      if ( p > end_p )
		{
		  DefaultLogSink().Error("Fill item short read: %d.\n", p - end_p);
		}
	    }
	  else if ( object->IsA(m_Dict->ul(MDD_Primer)) ) // TODO: only one primer should be found
	    {
	      delete object;
	      result = m_Primer.InitFromBuffer(redo_p, end_p - redo_p);
	    }
	  else
	    {
	      m_PacketList->AddPacket(object); // takes ownership

	      if ( object->IsA(m_Dict->ul(MDD_Preface)) && m_Preface == 0 )
		m_Preface = (Preface*)object;
	    }
	}
      else
	{
	  DefaultLogSink().Error("Error initializing OP1a header packet.\n");
	  //	  Kumu::hexdump(p-object->PacketLength(), object->PacketLength());
	  delete object;
	}
    }

  return result;
}